

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IexBaseExc.cpp
# Opt level: O2

void __thiscall Iex_2_5::TypeExc::~TypeExc(TypeExc *this)

{
  *(undefined ***)&this->super_BaseExc = &PTR__TypeExc_00164690;
  std::__cxx11::string::~string((string *)&(this->super_BaseExc)._stackTrace);
  std::__cxx11::string::~string((string *)&(this->super_BaseExc)._message);
  std::exception::~exception((exception *)this);
  return;
}

Assistant:

BaseExc::~BaseExc () throw ()
{
}